

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O3

int CVmObjList::getp_map(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  CVmObjPageEntry *pCVar1;
  ushort *lst_00;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  vm_rcdesc rc;
  vm_rcdesc local_78;
  
  if (getp_map(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_map();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&getp_map::desc);
  if (iVar6 == 0) {
    vm_rcdesc::init(&local_78,(EVP_PKEY_CTX *)"List.mapAll");
    pvVar5 = sp_;
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    pvVar4 = sp_;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar5->val = aVar2;
    vVar7 = create(0,lst);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar7;
    pvVar4 = sp_;
    pCVar1 = G_obj_table_X.pages_[vVar7 >> 0xc];
    lst_00 = *(ushort **)((long)&pCVar1[vVar7 & 0xfff].ptr_ + 8);
    uVar9 = (ulong)*lst_00;
    uVar3 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar4->typ = retval->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    if (uVar9 != 0) {
      lVar8 = 2;
      uVar10 = 0;
      do {
        pvVar4 = sp_;
        uVar10 = uVar10 + 1;
        sp_ = sp_ + 1;
        index_list(pvVar4,(char *)lst_00,(uint)uVar10);
        CVmRun::call_func_ptr(&G_interpreter_X,pvVar5 + -1,1,&local_78,0);
        vmb_put_dh((char *)(*(long *)((long)&pCVar1[vVar7 & 0xfff].ptr_ + 8) + lVar8),&r0_);
        lVar8 = lVar8 + 5;
      } while (uVar9 != uVar10);
    }
    sp_ = sp_ + -3;
  }
  return 1;
}

Assistant:

int CVmObjList::getp_map(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                         const char *lst, uint *argc)
{
    uint orig_argc = (argc != 0 ? *argc : 0);
    const vm_val_t *func_val;
    size_t cnt;
    size_t idx;
    char *new_lst;
    CVmObjList *new_lst_obj;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* set up the recursive caller context */
    vm_rcdesc rc(vmg_ "List.mapAll", self_val, 2, G_stk->get(0), orig_argc);

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while allocating to protect from gc */
    G_stk->push(self_val);

    /* 
     *   Make a copy of our list for the return value, since the result
     *   value is always the same size as our current list.  By making a
     *   copy of the input list, we also can avoid worrying about whether
     *   the input list was a constant, and hence we don't have to worry
     *   about the possibility of constant page swapping - we'll just
     *   update elements of the copy in-place.  
     */
    retval->set_obj(create(vmg_ FALSE, lst));

    /* get the return value list data */
    new_lst_obj = (CVmObjList *)vm_objp(vmg_ retval->val.obj);
    new_lst = new_lst_obj->ext_;

    /* get the length of the list */
    cnt = vmb_get_len(new_lst);

    /* 
     *   push a reference to the new list to protect it from the garbage
     *   collector, which could be invoked in the course of executing the
     *   user callback 
     */
    G_stk->push(retval);

    /*
     *   Go through each element of our list, and invoke the callback on
     *   each element.  Replace each element with the result of the
     *   callback.  
     */
    for (idx = 0 ; idx < cnt ; ++idx)
    {
        /* 
         *   get this element (using a 1-based index), and push it as the
         *   callback's argument 
         */
        index_and_push(vmg_ new_lst, idx + 1);
        
        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* store the result in the list */
        new_lst_obj->cons_set_element(idx, G_interpreter->get_r0());
    }

    /* discard our gc protection (self, return value) and our arguments */
    G_stk->discard(3);

    /* handled */
    return TRUE;
}